

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void copy_suite::copy_integer(void)

{
  undefined1 *puVar1;
  type_conflict7 local_4b8;
  undefined1 local_4ab;
  undefined1 local_4aa [2];
  undefined1 local_4a8 [8];
  variable copy_9;
  variable data_9;
  undefined8 local_440;
  unsigned_long_long value_9;
  undefined1 local_42b;
  undefined1 local_42a [2];
  undefined1 local_428 [8];
  variable copy_8;
  variable data_8;
  undefined8 local_3c0;
  longlong value_8;
  undefined1 local_3ab;
  undefined1 local_3aa [2];
  undefined1 local_3a8 [8];
  variable copy_7;
  variable data_7;
  undefined8 local_340;
  unsigned_long value_7;
  undefined1 local_32b;
  undefined1 local_32a [2];
  undefined1 local_328 [8];
  variable copy_6;
  variable data_6;
  long value_6;
  undefined1 local_2b8 [8];
  variable copy_5;
  variable data_5;
  type_conflict4 local_250;
  uint value_5;
  undefined1 local_248 [8];
  variable copy_4;
  variable data_4;
  type_conflict3 local_1de;
  int value_4;
  undefined1 local_1d8 [8];
  variable copy_3;
  variable data_3;
  undefined2 local_170;
  type_conflict2 local_16e;
  undefined1 local_16b;
  undefined1 local_16a [2];
  unsigned_short value_3;
  variable copy_2;
  variable data_2;
  undefined2 local_100;
  type_conflict1 local_fd [2];
  undefined1 local_fb;
  undefined1 local_fa [2];
  short value_2;
  variable copy_1;
  variable data_1;
  undefined1 local_8a;
  type_conflict local_89 [2];
  undefined1 local_87;
  undefined1 local_86 [4];
  uchar value_1;
  undefined1 local_78 [8];
  variable copy;
  variable data;
  undefined1 local_9 [8];
  char value;
  
  local_9[0] = 2;
  puVar1 = &copy.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<signed_char>
            ((basic_variable<std::allocator<char>_> *)puVar1,'\x02');
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_78,
             (basic_variable<std::allocator<char>_> *)puVar1);
  local_86[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<signed_char>
                          ((basic_variable<std::allocator<char>_> *)local_78);
  local_87 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.same<signed char>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x614,"void copy_suite::copy_integer()",local_86,&local_87);
  local_89[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<signed_char>
                          ((basic_variable<std::allocator<char>_> *)local_78);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,signed_char,signed_char>
            ("copy.value<signed char>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x615,"void copy_suite::copy_integer()",local_89,local_9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy.storage.field_0x28);
  local_8a = 2;
  puVar1 = &copy_1.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_char>
            ((basic_variable<std::allocator<char>_> *)puVar1,'\x02');
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&value_2,
             (basic_variable<std::allocator<char>_> *)puVar1);
  local_fa[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_char>
                          ((basic_variable<std::allocator<char>_> *)&value_2);
  local_fb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.same<unsigned char>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x61b,"void copy_suite::copy_integer()",local_fa,&local_fb);
  local_fd[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_char>
                          ((basic_variable<std::allocator<char>_> *)&value_2);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,unsigned_char>
            ("copy.value<unsigned char>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x61c,"void copy_suite::copy_integer()",local_fd,&local_8a);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&value_2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy_1.storage.field_0x28);
  local_100 = 2;
  puVar1 = &copy_2.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<short>
            ((basic_variable<std::allocator<char>_> *)puVar1,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&value_3,
             (basic_variable<std::allocator<char>_> *)puVar1);
  local_16a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<short>
                           ((basic_variable<std::allocator<char>_> *)&value_3);
  local_16b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.same<signed short int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x622,"void copy_suite::copy_integer()",local_16a,&local_16b);
  local_16e = trial::dynamic::basic_variable<std::allocator<char>_>::value<short>
                        ((basic_variable<std::allocator<char>_> *)&value_3);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,short>
            ("copy.value<signed short int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x623,"void copy_suite::copy_integer()",&local_16e,&local_100);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&value_3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy_2.storage.field_0x28);
  local_170 = 2;
  puVar1 = &copy_3.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_short>
            ((basic_variable<std::allocator<char>_> *)puVar1,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1d8,
             (basic_variable<std::allocator<char>_> *)puVar1);
  value_4._2_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_short>
                 ((basic_variable<std::allocator<char>_> *)local_1d8);
  value_4._1_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.same<unsigned short int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x629,"void copy_suite::copy_integer()",(long)&value_4 + 2,(long)&value_4 + 1);
  local_1de = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_short>
                        ((basic_variable<std::allocator<char>_> *)local_1d8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_short,unsigned_short>
            ("copy.value<unsigned short int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x62a,"void copy_suite::copy_integer()",&local_1de,&local_170);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy_3.storage.field_0x28);
  data_4.storage._44_4_ = 2;
  puVar1 = &copy_4.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)puVar1,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_248,
             (basic_variable<std::allocator<char>_> *)puVar1);
  value_5._2_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::same<int>
                 ((basic_variable<std::allocator<char>_> *)local_248);
  value_5._1_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.same<signed int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x630,"void copy_suite::copy_integer()",(long)&value_5 + 2,(long)&value_5 + 1);
  local_250 = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                        ((basic_variable<std::allocator<char>_> *)local_248);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("copy.value<signed int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x631,"void copy_suite::copy_integer()",&local_250,&data_4.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_248);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy_4.storage.field_0x28);
  data_5.storage._44_4_ = 2;
  puVar1 = &copy_5.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            ((basic_variable<std::allocator<char>_> *)puVar1,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_2b8,
             (basic_variable<std::allocator<char>_> *)puVar1);
  value_6._6_1_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_int>
                 ((basic_variable<std::allocator<char>_> *)local_2b8);
  value_6._5_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.same<unsigned int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x637,"void copy_suite::copy_integer()",(long)&value_6 + 6,(long)&value_6 + 5);
  value_6._0_4_ =
       trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_int>
                 ((basic_variable<std::allocator<char>_> *)local_2b8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,unsigned_int>
            ("copy.value<unsigned int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x638,"void copy_suite::copy_integer()",&value_6,&data_5.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_2b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy_5.storage.field_0x28);
  data_6.storage._40_8_ = 2;
  puVar1 = &copy_6.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long>
            ((basic_variable<std::allocator<char>_> *)puVar1,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_328,
             (basic_variable<std::allocator<char>_> *)puVar1);
  local_32a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long>
                           ((basic_variable<std::allocator<char>_> *)local_328);
  local_32b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.same<signed long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x63e,"void copy_suite::copy_integer()",local_32a,&local_32b);
  value_7 = trial::dynamic::basic_variable<std::allocator<char>_>::value<long>
                      ((basic_variable<std::allocator<char>_> *)local_328);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("copy.value<signed long int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x63f,"void copy_suite::copy_integer()",&value_7,&data_6.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_328);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy_6.storage.field_0x28);
  local_340 = 2;
  puVar1 = &copy_7.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_long>
            ((basic_variable<std::allocator<char>_> *)puVar1,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_3a8,
             (basic_variable<std::allocator<char>_> *)puVar1);
  local_3aa[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_long>
                           ((basic_variable<std::allocator<char>_> *)local_3a8);
  local_3ab = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.same<unsigned long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x645,"void copy_suite::copy_integer()",local_3aa,&local_3ab);
  value_8 = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_long>
                      ((basic_variable<std::allocator<char>_> *)local_3a8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,unsigned_long>
            ("copy.value<unsigned long int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x646,"void copy_suite::copy_integer()",&value_8,&local_340);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy_7.storage.field_0x28);
  local_3c0 = 2;
  puVar1 = &copy_8.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_long>
            ((basic_variable<std::allocator<char>_> *)puVar1,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_428,
             (basic_variable<std::allocator<char>_> *)puVar1);
  local_42a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long_long>
                           ((basic_variable<std::allocator<char>_> *)local_428);
  local_42b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.same<signed long long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x64c,"void copy_suite::copy_integer()",local_42a,&local_42b);
  value_9 = trial::dynamic::basic_variable<std::allocator<char>_>::value<long_long>
                      ((basic_variable<std::allocator<char>_> *)local_428);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_long,long_long>
            ("copy.value<signed long long int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x64d,"void copy_suite::copy_integer()",&value_9,&local_3c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_428);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy_8.storage.field_0x28);
  local_440 = 2;
  puVar1 = &copy_9.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_long_long>
            ((basic_variable<std::allocator<char>_> *)puVar1,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_4a8,
             (basic_variable<std::allocator<char>_> *)puVar1);
  local_4aa[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<unsigned_long_long>
                           ((basic_variable<std::allocator<char>_> *)local_4a8);
  local_4ab = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("copy.same<unsigned long long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x653,"void copy_suite::copy_integer()",local_4aa,&local_4ab);
  local_4b8 = trial::dynamic::basic_variable<std::allocator<char>_>::value<unsigned_long_long>
                        ((basic_variable<std::allocator<char>_> *)local_4a8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long_long,unsigned_long_long>
            ("copy.value<unsigned long long int>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x654,"void copy_suite::copy_integer()",&local_4b8,&local_440);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_4a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&copy_9.storage.field_0x28);
  return;
}

Assistant:

void copy_integer()
{
    {
        signed char value = 2;
        variable data(value);
        variable copy(data);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.same<signed char>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.value<signed char>(), value);
    }
    {
        unsigned char value = 2U;
        variable data(value);
        variable copy(data);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.same<unsigned char>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.value<unsigned char>(), value);
    }
    {
        signed short int value = 2;
        variable data(value);
        variable copy(data);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.same<signed short int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.value<signed short int>(), value);
    }
    {
        unsigned short int value = 2U;
        variable data(value);
        variable copy(data);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.same<unsigned short int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.value<unsigned short int>(), value);
    }
    {
        signed int value = 2;
        variable data(value);
        variable copy(data);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.same<signed int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.value<signed int>(), value);
    }
    {
        unsigned int value = 2U;
        variable data(value);
        variable copy(data);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.same<unsigned int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.value<unsigned int>(), value);
    }
    {
        signed long int value = 2L;
        variable data(value);
        variable copy(data);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.same<signed long int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.value<signed long int>(), value);
    }
    {
        unsigned long int value = 2UL;
        variable data(value);
        variable copy(data);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.same<unsigned long int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.value<unsigned long int>(), value);
    }
    {
        signed long long int value = 2LL;
        variable data(value);
        variable copy(data);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.same<signed long long int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.value<signed long long int>(), value);
    }
    {
        unsigned long long int value = 2ULL;
        variable data(value);
        variable copy(data);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.same<unsigned long long int>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(copy.value<unsigned long long int>(), value);
    }
}